

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_SetCoupling(ARKodeMem ark_mem)

{
  void *pvVar1;
  int iVar2;
  MRIStepCoupling MRIC;
  int iVar3;
  int error_code;
  ARKODE_MRITableID method;
  char *msgfmt;
  sunindextype Clrw;
  sunindextype Cliw;
  long local_38;
  long local_30;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x6c8;
  }
  else {
    if (*(long *)((long)pvVar1 + 0x38) != 0) {
      return 0;
    }
    iVar2 = *(int *)((long)pvVar1 + 0x40);
    if (iVar2 - 5U < 0xfffffffc) {
      arkProcessError(ark_mem,-0x16,0x6d4,"mriStep_SetCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                      ,"No MRI method at requested order, using q=3.");
      iVar2 = 3;
    }
    if (*(int *)((long)pvVar1 + 0x1c) == 0) {
      method = ARKODE_MRI_GARK_FORWARD_EULER;
      if (iVar2 - 2U < 3) {
        method = *(ARKODE_MRITableID *)(&DAT_001676a0 + (ulong)(iVar2 - 2U) * 4);
      }
    }
    else if (*(int *)((long)pvVar1 + 0x18) == 0) {
      method = ARKODE_MRI_GARK_BACKWARD_EULER;
      if (iVar2 - 2U < 3) {
        method = iVar2 + ARKODE_MRI_GARK_ERK33a;
      }
    }
    else {
      method = (uint)(iVar2 - 2U < 3) + ARKODE_IMEX_MRI_GARK_EULER;
    }
    MRIC = MRIStepCoupling_LoadTable(method);
    *(MRIStepCoupling *)((long)pvVar1 + 0x38) = MRIC;
    if (MRIC != (MRIStepCoupling)0x0) {
      MRIStepCoupling_Space(MRIC,&local_30,&local_38);
      ark_mem->liw = ark_mem->liw + local_30;
      ark_mem->lrw = ark_mem->lrw + local_38;
      *(undefined4 *)((long)pvVar1 + 0x48) = *(undefined4 *)(*(long *)((long)pvVar1 + 0x38) + 4);
      *(undefined8 *)((long)pvVar1 + 0x40) = *(undefined8 *)(*(long *)((long)pvVar1 + 0x38) + 8);
      return 0;
    }
    msgfmt = "An error occurred in constructing coupling table.";
    iVar3 = -0x29;
    error_code = -0x29;
    iVar2 = 0x702;
  }
  arkProcessError(ark_mem,error_code,iVar2,"mriStep_SetCoupling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int mriStep_SetCoupling(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  sunindextype Cliw, Clrw;
  int q_actual;
  ARKODE_MRITableID table_id;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
  q_actual = step_mem->q;

  /* if coupling has already been specified, just return */
  if (step_mem->MRIC != NULL) { return (ARK_SUCCESS); }

  if (q_actual < 1 || q_actual > 4)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "No MRI method at requested order, using q=3.");
    q_actual = 3;
  }

  /* select method based on order and type */

  /**** ImEx methods ****/
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    switch (q_actual)
    {
    case 1: table_id = MRISTEP_DEFAULT_IMEX_SD_1; break;
    case 2: table_id = MRISTEP_DEFAULT_IMEX_SD_2; break;
    case 3: table_id = MRISTEP_DEFAULT_IMEX_SD_2; break;
    case 4: table_id = MRISTEP_DEFAULT_IMEX_SD_2; break;
    }

    /**** implicit methods ****/
  }
  else if (step_mem->implicit_rhs)
  {
    switch (q_actual)
    {
    case 1: table_id = MRISTEP_DEFAULT_IMPL_SD_1; break;
    case 2: table_id = MRISTEP_DEFAULT_IMPL_SD_2; break;
    case 3: table_id = MRISTEP_DEFAULT_IMPL_SD_3; break;
    case 4: table_id = MRISTEP_DEFAULT_IMPL_SD_4; break;
    }

    /**** explicit methods ****/
  }
  else
  {
    switch (q_actual)
    {
    case 1: table_id = MRISTEP_DEFAULT_EXPL_1; break;
    case 2: table_id = MRISTEP_DEFAULT_EXPL_2; break;
    case 3: table_id = MRISTEP_DEFAULT_EXPL_3; break;
    case 4: table_id = MRISTEP_DEFAULT_EXPL_4; break;
    }
  }

  step_mem->MRIC = MRIStepCoupling_LoadTable(table_id);
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "An error occurred in constructing coupling table.");
    return (ARK_INVALID_TABLE);
  }

  /* note coupling structure space requirements */
  MRIStepCoupling_Space(step_mem->MRIC, &Cliw, &Clrw);
  ark_mem->liw += Cliw;
  ark_mem->lrw += Clrw;

  /* set [redundant] stored values for stage numbers and
     method/embedding orders */
  step_mem->stages = step_mem->MRIC->stages;
  step_mem->q      = step_mem->MRIC->q;
  step_mem->p      = step_mem->MRIC->p;

  return (ARK_SUCCESS);
}